

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

void ImGuiStb::stb_text_redo(ImGuiTextEditState *str,STB_TexteditState *state)

{
  undefined4 uVar1;
  undefined4 pos;
  undefined2 uVar2;
  undefined2 uVar3;
  ImWchar IVar4;
  StbUndoRecord *pSVar5;
  StbUndoRecord *pSVar6;
  int local_38;
  int iStack_34;
  int i;
  StbUndoRecord r;
  StbUndoRecord *u;
  StbUndoState *s;
  STB_TexteditState *state_local;
  ImGuiTextEditState *str_local;
  
  if ((state->undostate).redo_point != 99) {
    pSVar5 = (state->undostate).undo_rec + (state->undostate).undo_point;
    pSVar6 = (state->undostate).undo_rec + (state->undostate).redo_point;
    pos = pSVar6->where;
    uVar2 = pSVar6->insert_length;
    uVar3 = pSVar6->delete_length;
    uVar1 = *(undefined4 *)&pSVar6->char_storage;
    pSVar5->delete_length = uVar2;
    pSVar5->insert_length = uVar3;
    pSVar5->where = pos;
    pSVar5->char_storage = -1;
    if (uVar3 != 0) {
      if ((int)(state->undostate).redo_char_point <
          (int)(state->undostate).undo_char_point + (int)pSVar5->insert_length) {
        pSVar5->insert_length = 0;
        pSVar5->delete_length = 0;
      }
      else {
        pSVar5->char_storage = (state->undostate).undo_char_point;
        (state->undostate).undo_char_point =
             (state->undostate).undo_char_point + pSVar5->insert_length;
        for (local_38 = 0; local_38 < pSVar5->insert_length; local_38 = local_38 + 1) {
          IVar4 = STB_TEXTEDIT_GETCHAR(str,pSVar5->where + local_38);
          (state->undostate).undo_char[pSVar5->char_storage + local_38] = IVar4;
        }
      }
      STB_TEXTEDIT_DELETECHARS(str,pos,(int)(short)uVar3);
    }
    if (uVar2 != 0) {
      r.where._0_2_ = (short)uVar1;
      STB_TEXTEDIT_INSERTCHARS
                (str,pos,(state->undostate).undo_char + (short)r.where,(int)(short)uVar2);
      (state->undostate).redo_char_point = (state->undostate).redo_char_point + uVar2;
    }
    state->cursor = pos + (int)(short)uVar2;
    (state->undostate).undo_point = (state->undostate).undo_point + 1;
    (state->undostate).redo_point = (state->undostate).redo_point + 1;
  }
  return;
}

Assistant:

static void stb_text_redo(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   StbUndoState *s = &state->undostate;
   StbUndoRecord *u, r;
   if (s->redo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
      return;

   // we need to do two things: apply the redo record, and create an undo record
   u = &s->undo_rec[s->undo_point];
   r = s->undo_rec[s->redo_point];

   // we KNOW there must be room for the undo record, because the redo record
   // was derived from an undo record

   u->delete_length = r.insert_length;
   u->insert_length = r.delete_length;
   u->where = r.where;
   u->char_storage = -1;

   if (r.delete_length) {
      // the redo record requires us to delete characters, so the undo record
      // needs to store the characters

      if (s->undo_char_point + u->insert_length > s->redo_char_point) {
         u->insert_length = 0;
         u->delete_length = 0;
      } else {
         int i;
         u->char_storage = s->undo_char_point;
         s->undo_char_point = s->undo_char_point + u->insert_length;

         // now save the characters
         for (i=0; i < u->insert_length; ++i)
            s->undo_char[u->char_storage + i] = STB_TEXTEDIT_GETCHAR(str, u->where + i);
      }

      STB_TEXTEDIT_DELETECHARS(str, r.where, r.delete_length);
   }

   if (r.insert_length) {
      // easy case: need to insert n characters
      STB_TEXTEDIT_INSERTCHARS(str, r.where, &s->undo_char[r.char_storage], r.insert_length);
      s->redo_char_point += r.insert_length;
   }

   state->cursor = r.where + r.insert_length;

   s->undo_point++;
   s->redo_point++;
}